

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall Parser::~Parser(Parser *this)

{
  QString::~QString((QString *)0x105d03);
  QList<QString>::~QList((QList<QString> *)0x105d14);
  QList<LineNumber>::~QList((QList<LineNumber> *)0x105d22);
  QList<QString>::~QList((QList<QString> *)0x105d30);
  QList<QString>::~QList((QList<QString> *)0x105d3e);
  QList<Replace>::~QList((QList<Replace> *)0x105d4c);
  QList<Point>::~QList((QList<Point> *)0x105d5a);
  QList<Function>::~QList((QList<Function> *)0x105d64);
  return;
}

Assistant:

Parser(const QString &provider)
        : m_provider(provider)
    {

    }